

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlcatalog.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  FILE *pFVar7;
  char *pcVar8;
  size_t sVar9;
  byte *__dest;
  ulong uVar10;
  byte *pbVar11;
  byte bVar12;
  uint uVar13;
  byte *pbVar14;
  char *pcVar15;
  char *pcVar16;
  int iVar17;
  ulong uVar18;
  int local_4d8;
  long local_4c8 [20];
  char command [100];
  char arg [400];
  char local_228 [500];
  undefined1 local_34;
  
  if (argc < 2) {
LAB_001023b8:
    pcVar8 = *argv;
LAB_001023bb:
    usage(pcVar8);
    return 1;
  }
  iVar17 = 1;
  xmlCheckVersion(0x5398);
LAB_001023eb:
  iVar2 = sgml;
  if (((argc <= iVar17) || (pcVar8 = argv[iVar17], *pcVar8 != '-')) || (pcVar8[1] == '\0'))
  goto LAB_00102616;
  iVar2 = strcmp(pcVar8,"-verbose");
  if (((iVar2 == 0) || ((pcVar8[1] == 'v' && (pcVar8[2] == '\0')))) ||
     (iVar2 = strcmp(pcVar8,"--verbose"), iVar2 == 0)) {
    verbose = verbose + 1;
    xmlCatalogSetDebug();
  }
  else {
    iVar2 = strcmp(pcVar8,"-noout");
    if ((iVar2 != 0) && (iVar2 = strcmp(pcVar8,"--noout"), iVar2 != 0)) {
      iVar2 = strcmp(pcVar8,"-shell");
      if ((iVar2 != 0) && (iVar2 = strcmp(pcVar8,"--shell"), iVar2 != 0)) {
        iVar2 = strcmp(pcVar8,"-sgml");
        if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"--sgml"), iVar2 == 0)) {
          sgml = sgml + 1;
        }
        else {
          iVar2 = strcmp(pcVar8,"-create");
          if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"--create"), iVar2 == 0)) {
            create = create + 1;
          }
          else {
            iVar2 = strcmp(pcVar8,"-convert");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"--convert"), iVar2 == 0)) {
              convert = convert + 1;
            }
            else {
              iVar2 = strcmp(pcVar8,"-no-super-update");
              if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"--no-super-update"), iVar2 == 0)) {
                no_super_update = no_super_update + 1;
              }
              else {
                iVar2 = strcmp(pcVar8,"-add");
                if ((iVar2 != 0) && (iVar2 = strcmp(pcVar8,"--add"), iVar2 != 0)) {
                  iVar2 = strcmp(pcVar8,"-del");
                  if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"--del"), iVar2 == 0)) {
                    iVar17 = iVar17 + 1;
                    del = del + 1;
                    goto LAB_001025db;
                  }
                  fprintf(_stderr,"Unknown option %s\n",pcVar8);
                  goto LAB_001023b8;
                }
                iVar17 = iVar17 + 2 + (uint)(sgml == 0);
                add = add + 1;
              }
            }
          }
        }
        goto LAB_001025db;
      }
      shell = shell + 1;
    }
    noout = 1;
  }
LAB_001025db:
  iVar17 = iVar17 + 1;
  goto LAB_001023eb;
LAB_00102d29:
  iVar17 = bcmp(command,"exit",5);
  if (((iVar17 == 0) || (iVar17 = bcmp(command,"quit",5), uVar1 = command._0_4_, iVar17 == 0)) ||
     (command._0_4_ == 0x657962)) {
    free(__dest);
    goto LAB_0010319a;
  }
  iVar17 = bcmp(command,"public",7);
  lVar5 = local_4c8[0];
  if (iVar17 == 0) {
    if (uVar13 == 1) {
      pcVar8 = (char *)xmlCatalogResolvePublic(local_4c8[0]);
      if (pcVar8 == (char *)0x0) {
        pcVar8 = "No entry for PUBLIC %s\n";
LAB_00103004:
        printf(pcVar8,lVar5);
      }
      else {
LAB_00102e29:
        puts(pcVar8);
LAB_00102e37:
        (*_xmlFree)(pcVar8);
      }
      goto LAB_00103053;
    }
    pcVar8 = "public requires 1 arguments";
  }
  else {
    iVar17 = bcmp(command,"system",7);
    lVar5 = local_4c8[0];
    if (iVar17 == 0) {
      if (uVar13 == 1) {
        pcVar8 = (char *)xmlCatalogResolveSystem(local_4c8[0]);
        if (pcVar8 == (char *)0x0) {
          pcVar8 = "No entry for SYSTEM %s\n";
          goto LAB_00103004;
        }
        goto LAB_00102e29;
      }
      pcVar8 = "system requires 1 arguments";
    }
    else if (uVar1 == 0x6c6564) {
      if (uVar13 == 1) {
        iVar17 = xmlCatalogRemove(local_4c8[0]);
        if (0 < iVar17) goto LAB_00103053;
        pcVar8 = "del command failed";
LAB_00103081:
        puts(pcVar8);
        goto LAB_00103053;
      }
      pcVar8 = "del requires 1";
    }
    else if (uVar1 == 0x646461) {
      if (0xfffffffd < uVar13 - 4) {
        lVar5 = local_4c8[2];
        lVar6 = local_4c8[1];
        if (local_4c8[2] == 0) {
          lVar5 = local_4c8[1];
          lVar6 = 0;
        }
        iVar17 = xmlCatalogAdd(local_4c8[0],lVar6,lVar5);
        if (iVar17 != 0) {
          pcVar8 = "add command failed";
          goto LAB_00103081;
        }
        goto LAB_00103053;
      }
      pcVar8 = "add requires 2 or 3 arguments";
    }
    else if (CONCAT44(command._4_4_,command._0_4_) == 0x65766c6f736572) {
      if (uVar13 == 2) {
        pcVar8 = (char *)xmlCatalogResolve(local_4c8[0],local_4c8[1]);
        if (pcVar8 == (char *)0x0) {
          pcVar8 = "Resolver failed to find an answer";
          goto LAB_00103081;
        }
        puts(pcVar8);
        goto LAB_00102e37;
      }
      pcVar8 = "resolve requires 2 arguments";
    }
    else {
      iVar17 = bcmp(command,"dump",5);
      if (iVar17 == 0) {
        if (uVar10 == 0) {
          xmlCatalogDump(_stdout);
          goto LAB_00103053;
        }
        pcVar8 = "dump has no arguments";
      }
      else {
        iVar17 = bcmp(command,"debug",6);
        if (iVar17 != 0) {
          iVar17 = bcmp(command,"quiet",6);
          if (iVar17 != 0) {
            iVar17 = bcmp(command,"help",5);
            if (iVar17 != 0) {
              printf("Unrecognized command %s\n",command);
            }
            puts("Commands available:");
            puts("\tpublic PublicID: make a PUBLIC identifier lookup");
            puts("\tsystem SystemID: make a SYSTEM identifier lookup");
            puts("\tresolve PublicID SystemID: do a full resolver lookup");
            puts("\tadd \'type\' \'orig\' \'replace\' : add an entry");
            puts("\tdel \'values\' : remove values");
            puts("\tdump: print the current catalog state");
            puts("\tdebug: increase the verbosity level");
            puts("\tquiet: decrease the verbosity level");
            pcVar8 = "\texit:  quit the shell";
            goto LAB_00103081;
          }
          if (uVar10 == 0) {
            if (0 < verbose) {
              verbose = verbose + -1;
            }
            xmlCatalogSetDebug();
            goto LAB_00103053;
          }
          pcVar8 = "quiet has no arguments";
          goto LAB_00103081;
        }
        if (uVar10 == 0) {
          verbose = verbose + 1;
          xmlCatalogSetDebug();
          goto LAB_00103053;
        }
        pcVar8 = "debug has no arguments";
      }
    }
  }
  puts(pcVar8);
  goto LAB_00103053;
LAB_00102616:
  iVar17 = 1;
  while (iVar17 < argc) {
    pcVar8 = argv[iVar17];
    iVar3 = strcmp(pcVar8,"-add");
    if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--add"), iVar3 == 0)) {
      if (iVar2 == 0) {
        iVar3 = iVar17 + 3;
      }
      else {
        iVar3 = iVar17 + 2;
      }
    }
    else {
      iVar3 = strcmp(pcVar8,"-del");
      if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--del"), iVar3 == 0)) {
        iVar3 = iVar17 + 1;
        if ((iVar3 == argc) || ((iVar2 != 0 && (iVar17 + 2 == argc)))) {
          fwrite("No catalog entry specified to remove from\n",0x2a,1,_stderr);
          pcVar8 = *argv;
          goto LAB_001023bb;
        }
      }
      else {
        iVar3 = iVar17;
        if (*pcVar8 != '-') {
          if ((*pcVar8 == '\0') && (filename == (char *)0x0)) {
            xmlInitializeCatalog();
          }
          else {
            filename = pcVar8;
            iVar2 = xmlLoadCatalog(pcVar8);
            if ((iVar2 < 0) && (create != 0)) {
              xmlCatalogAdd("catalog",argv[iVar17],0);
            }
            xmlCatalogResolvePublic("");
          }
          break;
        }
      }
    }
    iVar17 = iVar3 + 1;
  }
  if (convert != 0) {
    xmlCatalogConvert();
  }
  if (del == 0 && add == 0) {
    if (shell == 0) {
      lVar5 = (long)iVar17;
      local_4d8 = 0;
      while (lVar5 = lVar5 + 1, lVar5 < (long)(ulong)(uint)argc) {
        lVar6 = xmlParseURI(argv[lVar5]);
        if (lVar6 == 0) {
          pcVar8 = (char *)xmlCatalogResolvePublic(argv[lVar5]);
          if (pcVar8 != (char *)0x0) goto LAB_00103143;
          pcVar8 = argv[lVar5];
          pcVar16 = "No entry for PUBLIC %s\n";
LAB_0010317b:
          printf(pcVar16,pcVar8);
          local_4d8 = 4;
        }
        else {
          xmlFreeURI(lVar6);
          pcVar8 = (char *)xmlCatalogResolveSystem(argv[lVar5]);
          if (pcVar8 == (char *)0x0) {
            printf("No entry for SYSTEM %s\n",argv[lVar5]);
            pcVar8 = (char *)xmlCatalogResolveURI(argv[lVar5]);
            if (pcVar8 == (char *)0x0) {
              pcVar8 = argv[lVar5];
              pcVar16 = "No entry for URI %s\n";
              goto LAB_0010317b;
            }
          }
LAB_00103143:
          puts(pcVar8);
          (*_xmlFree)(pcVar8);
        }
      }
    }
    else {
      while( true ) {
        fputs("> ",_stdout);
        fflush(_stdout);
        pcVar8 = fgets(local_228,500,_stdin);
        if (pcVar8 == (char *)0x0) break;
        local_34 = 0;
        sVar9 = strlen(local_228);
        sVar9 = (size_t)((int)sVar9 + 1);
        __dest = (byte *)malloc(sVar9);
        if (__dest == (byte *)0x0) break;
        memcpy(__dest,local_228,sVar9);
        for (pbVar14 = __dest; (bVar12 = *pbVar14, bVar12 == 9 || (bVar12 == 0x20));
            pbVar14 = pbVar14 + 1) {
        }
        uVar10 = 0;
        while ((uVar18 = (ulong)bVar12, 0x20 < bVar12 ||
               ((0x100002601U >> (uVar18 & 0x3f) & 1) == 0))) {
          command[uVar10] = bVar12;
          bVar12 = pbVar14[uVar10 + 1];
          uVar10 = uVar10 + 1;
        }
        command[uVar10 & 0xffffffff] = '\0';
        if (uVar10 != 0) {
          pbVar14 = pbVar14 + uVar10;
          memset(arg,0,400);
          while (((char)uVar18 == '\t' || ((int)uVar18 == 0x20))) {
            pbVar11 = pbVar14 + 1;
            pbVar14 = pbVar14 + 1;
            uVar18 = (ulong)*pbVar11;
          }
          uVar10 = 0;
          while ((0xd < (byte)uVar18 || ((0x2401U >> ((uint)uVar18 & 0x1f) & 1) == 0))) {
            arg[uVar10] = (byte)uVar18;
            uVar18 = (ulong)pbVar14[uVar10 + 1];
            uVar10 = uVar10 + 1;
          }
          arg[uVar10 & 0xffffffff] = '\0';
          uVar13 = 0;
          memset(local_4c8,0,0xa0);
          pbVar14 = (byte *)arg;
          do {
            uVar10 = (ulong)uVar13;
LAB_00102cb3:
            bVar12 = *pbVar14;
            pbVar11 = pbVar14;
            if (bVar12 == 0) goto LAB_00102d29;
            while ((pbVar14 = pbVar11 + 1, bVar12 == 9 || (bVar12 == 0x20))) {
              pbVar11 = pbVar14;
              bVar12 = *pbVar14;
            }
            if (bVar12 == 0x22) {
              local_4c8[uVar10] = (long)pbVar14;
              for (; *pbVar14 != 0; pbVar14 = pbVar14 + 1) {
                if (*pbVar14 == 0x22) goto LAB_00102d1f;
              }
              goto LAB_00102cb3;
            }
            if (bVar12 == 0x27) {
              local_4c8[uVar10] = (long)pbVar14;
              for (; *pbVar14 != 0; pbVar14 = pbVar14 + 1) {
                if (*pbVar14 == 0x27) goto LAB_00102d1f;
              }
              goto LAB_00102cb3;
            }
            local_4c8[uVar10] = (long)pbVar11;
            while ((0x20 < (ulong)*pbVar11 ||
                   (pbVar14 = pbVar11, (0x100000201U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))) {
              pbVar11 = pbVar11 + 1;
            }
LAB_00102d1f:
            *pbVar14 = 0;
            uVar13 = uVar13 + 1;
            pbVar14 = pbVar14 + 1;
          } while( true );
        }
LAB_00103053:
        free(__dest);
      }
LAB_0010319a:
      local_4d8 = 0;
    }
  }
  else {
    local_4d8 = 0;
    iVar17 = 1;
    while (iVar17 < argc) {
      pcVar8 = argv[iVar17];
      iVar2 = iVar17;
      if (*pcVar8 == '-') {
        if (pcVar8[1] == '\0') break;
        iVar3 = strcmp(pcVar8,"-add");
        if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--add"), iVar3 == 0)) {
          if (sgml == 0) {
LAB_0010295a:
            pcVar8 = argv[(long)iVar17 + 3];
            if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
              pcVar16 = argv[(long)iVar17 + 1];
              pcVar8 = argv[(long)iVar17 + 2];
              pcVar15 = (char *)0x0;
            }
            else {
              pcVar16 = argv[(long)iVar17 + 1];
              pcVar15 = argv[(long)iVar17 + 2];
            }
            iVar3 = xmlCatalogAdd(pcVar16,pcVar15,pcVar8);
            iVar2 = iVar17 + 3;
            if (iVar3 != 0) {
              puts("add command failed");
              local_4d8 = 3;
            }
          }
          else {
LAB_00102846:
            lVar5 = xmlLoadSGMLSuperCatalog(argv[(long)iVar17 + 1]);
            pcVar8 = argv[iVar17];
            iVar2 = strcmp(pcVar8,"-add");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"--add"), iVar2 == 0)) {
              if (lVar5 == 0) {
                lVar5 = xmlNewCatalog(1);
              }
              xmlACatalogAdd(lVar5,"CATALOG",argv[(long)iVar17 + 2],0);
              if (no_super_update == 0) {
                lVar6 = xmlLoadSGMLSuperCatalog("/usr/local/etc/sgml/catalog");
                if (lVar6 == 0) {
                  lVar6 = xmlNewCatalog(1);
                }
                xmlACatalogAdd(lVar6,"CATALOG",argv[(long)iVar17 + 1],0);
              }
              else {
LAB_00102952:
                lVar6 = 0;
              }
LAB_001029db:
              if (noout != 0) goto LAB_001029e4;
LAB_00102a06:
              xmlACatalogDump(lVar5,_stdout);
            }
            else {
              if ((lVar5 == 0) ||
                 (iVar2 = xmlACatalogRemove(lVar5,argv[(long)iVar17 + 2]), iVar2 < 0)) {
                fprintf(_stderr,"Failed to remove entry from %s\n",argv[(long)iVar17 + 1]);
                local_4d8 = 1;
              }
              if (((lVar5 != 0) && (no_super_update == 0)) && ((noout & 1) != 0)) {
                iVar2 = xmlCatalogIsEmpty(lVar5);
                if ((iVar2 == 0) ||
                   (lVar6 = xmlLoadSGMLSuperCatalog("/usr/local/etc/sgml/catalog"), lVar6 == 0))
                goto LAB_00102952;
                iVar2 = xmlACatalogRemove(lVar6,argv[(long)iVar17 + 1]);
                if (iVar2 < 0) {
                  fprintf(_stderr,"Failed to remove entry from %s\n","/usr/local/etc/sgml/catalog");
                  local_4d8 = 1;
                }
                goto LAB_001029db;
              }
              lVar6 = 0;
              if ((noout & 1) == 0) goto LAB_00102a06;
LAB_001029e4:
              iVar2 = xmlCatalogIsEmpty(lVar5);
              if (iVar2 == 0) {
                pFVar7 = fopen64(argv[(long)iVar17 + 1],"wb");
                if (pFVar7 == (FILE *)0x0) {
                  fprintf(_stderr,"could not open %s for saving\n",argv[(long)iVar17 + 1]);
                  noout = 0;
                  local_4d8 = 2;
                }
                else {
                  xmlACatalogDump(lVar5,pFVar7);
                  fclose(pFVar7);
                }
              }
              else {
                remove(argv[(long)iVar17 + 1]);
              }
              if ((lVar6 != 0) && (no_super_update == 0)) {
                iVar2 = xmlCatalogIsEmpty(lVar6);
                if (iVar2 == 0) {
                  pFVar7 = fopen64("/usr/local/etc/sgml/catalog","wb");
                  if (pFVar7 == (FILE *)0x0) {
                    fprintf(_stderr,"could not open %s for saving\n","/usr/local/etc/sgml/catalog");
                    noout = 0;
                    local_4d8 = 2;
                  }
                  else {
                    xmlACatalogDump(lVar6,pFVar7);
                    fclose(pFVar7);
                  }
                }
                else {
                  remove("/usr/local/etc/sgml/catalog");
                }
              }
            }
            iVar2 = iVar17 + 2;
            xmlFreeCatalog(lVar5);
            xmlFreeCatalog(lVar6);
          }
        }
        else {
          iVar4 = strcmp(pcVar8,"-del");
          if ((iVar4 == 0) || (iVar4 = strcmp(pcVar8,"--del"), iVar4 == 0)) {
            if (sgml != 0) goto LAB_00102846;
            if (iVar3 == 0) goto LAB_0010295a;
            iVar3 = strcmp(pcVar8,"-del");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--del"), iVar3 == 0)) {
              iVar2 = iVar17 + 1;
              iVar3 = xmlCatalogRemove(argv[(long)iVar17 + 1]);
              if (iVar3 < 0) {
                fprintf(_stderr,"Failed to remove entry %s\n",argv[(long)iVar17 + 1]);
                local_4d8 = 1;
              }
            }
          }
        }
      }
      iVar17 = iVar2 + 1;
    }
  }
  if ((sgml == 0) && ((((add != 0 || (del != 0)) || (create != 0)) || (convert != 0)))) {
    pFVar7 = _stdout;
    if ((((filename != (char *)0x0 & noout) == 1) && (*filename != '\0')) &&
       (pFVar7 = fopen64(filename,"wb"), pFVar7 == (FILE *)0x0)) {
      local_4d8 = 2;
      fprintf(_stderr,"could not open %s for saving\n",filename);
      noout = 0;
    }
    else {
      xmlCatalogDump(pFVar7);
    }
  }
  xmlCleanupParser();
  return local_4d8;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int ret;
    int exit_value = 0;

#ifdef _WIN32
    _setmode(_fileno(stdin), _O_BINARY);
    _setmode(_fileno(stdout), _O_BINARY);
    _setmode(_fileno(stderr), _O_BINARY);
#endif

    if (argc <= 1) {
	usage(argv[0]);
	return(1);
    }

    LIBXML_TEST_VERSION
    for (i = 1; i < argc ; i++) {
	if (!strcmp(argv[i], "-"))
	    break;

	if (argv[i][0] != '-')
	    break;
	if ((!strcmp(argv[i], "-verbose")) ||
	    (!strcmp(argv[i], "-v")) ||
	    (!strcmp(argv[i], "--verbose"))) {
	    verbose++;
	    xmlCatalogSetDebug(verbose);
	} else if ((!strcmp(argv[i], "-noout")) ||
	    (!strcmp(argv[i], "--noout"))) {
            noout = 1;
	} else if ((!strcmp(argv[i], "-shell")) ||
	    (!strcmp(argv[i], "--shell"))) {
	    shell++;
            noout = 1;
	} else if ((!strcmp(argv[i], "-sgml")) ||
	    (!strcmp(argv[i], "--sgml"))) {
	    sgml++;
	} else if ((!strcmp(argv[i], "-create")) ||
	    (!strcmp(argv[i], "--create"))) {
	    create++;
	} else if ((!strcmp(argv[i], "-convert")) ||
	    (!strcmp(argv[i], "--convert"))) {
	    convert++;
	} else if ((!strcmp(argv[i], "-no-super-update")) ||
	    (!strcmp(argv[i], "--no-super-update"))) {
	    no_super_update++;
	} else if ((!strcmp(argv[i], "-add")) ||
	    (!strcmp(argv[i], "--add"))) {
	    if (sgml)
		i += 2;
	    else
		i += 3;
	    add++;
	} else if ((!strcmp(argv[i], "-del")) ||
	    (!strcmp(argv[i], "--del"))) {
	    i += 1;
	    del++;
	} else {
	    fprintf(stderr, "Unknown option %s\n", argv[i]);
	    usage(argv[0]);
	    return(1);
	}
    }

    for (i = 1; i < argc; i++) {
	if ((!strcmp(argv[i], "-add")) ||
	    (!strcmp(argv[i], "--add"))) {
	    if (sgml)
		i += 2;
	    else
		i += 3;
	    continue;
	} else if ((!strcmp(argv[i], "-del")) ||
	    (!strcmp(argv[i], "--del"))) {
	    i += 1;

	    /* No catalog entry specified */
	    if (i == argc || (sgml && i + 1 == argc)) {
		fprintf(stderr, "No catalog entry specified to remove from\n");
		usage (argv[0]);
		return(1);
	    }

	    continue;
	} else if (argv[i][0] == '-')
	    continue;

	if (filename == NULL && argv[i][0] == '\0') {
	    /* Interpret empty-string catalog specification as
	       a shortcut for a default system catalog. */
	    xmlInitializeCatalog();
	} else {
	    filename = argv[i];
	    ret = xmlLoadCatalog(argv[i]);
	    if ((ret < 0) && (create)) {
		xmlCatalogAdd(BAD_CAST "catalog", BAD_CAST argv[i], NULL);
	    }

            /*
             * Catalogs are loaded lazily. Make sure that dumping works
             * by the issuing a dummy request that forces the catalog to
             * be loaded.
             */
            xmlCatalogResolvePublic(BAD_CAST "");
	}
	break;
    }

    if (convert)
        ret = xmlCatalogConvert();

    if ((add) || (del)) {
	for (i = 1; i < argc ; i++) {
	    if (!strcmp(argv[i], "-"))
		break;

	    if (argv[i][0] != '-')
		continue;
	    if (strcmp(argv[i], "-add") && strcmp(argv[i], "--add") &&
		strcmp(argv[i], "-del") && strcmp(argv[i], "--del"))
		continue;

	    if (sgml) {
		/*
		 * Maintenance of SGML catalogs.
		 */
		xmlCatalogPtr catal = NULL;
		xmlCatalogPtr super = NULL;

		catal = xmlLoadSGMLSuperCatalog(argv[i + 1]);

		if ((!strcmp(argv[i], "-add")) ||
		    (!strcmp(argv[i], "--add"))) {
		    if (catal == NULL)
			catal = xmlNewCatalog(1);
		    xmlACatalogAdd(catal, BAD_CAST "CATALOG",
					 BAD_CAST argv[i + 2], NULL);

		    if (!no_super_update) {
			super = xmlLoadSGMLSuperCatalog(XML_SGML_DEFAULT_CATALOG);
			if (super == NULL)
			    super = xmlNewCatalog(1);

			xmlACatalogAdd(super, BAD_CAST "CATALOG",
					     BAD_CAST argv[i + 1], NULL);
		    }
		} else {
		    if (catal != NULL)
			ret = xmlACatalogRemove(catal, BAD_CAST argv[i + 2]);
		    else
			ret = -1;
		    if (ret < 0) {
			fprintf(stderr, "Failed to remove entry from %s\n",
				argv[i + 1]);
			exit_value = 1;
		    }
		    if ((!no_super_update) && (noout) && (catal != NULL) &&
			(xmlCatalogIsEmpty(catal))) {
			super = xmlLoadSGMLSuperCatalog(
				   XML_SGML_DEFAULT_CATALOG);
			if (super != NULL) {
			    ret = xmlACatalogRemove(super,
				    BAD_CAST argv[i + 1]);
			    if (ret < 0) {
				fprintf(stderr,
					"Failed to remove entry from %s\n",
					XML_SGML_DEFAULT_CATALOG);
				exit_value = 1;
			    }
			}
		    }
		}
		if (noout) {
		    FILE *out;

		    if (xmlCatalogIsEmpty(catal)) {
			remove(argv[i + 1]);
		    } else {
			out = fopen(argv[i + 1], "wb");
			if (out == NULL) {
			    fprintf(stderr, "could not open %s for saving\n",
				    argv[i + 1]);
			    exit_value = 2;
			    noout = 0;
			} else {
			    xmlACatalogDump(catal, out);
			    fclose(out);
			}
		    }
		    if (!no_super_update && super != NULL) {
			if (xmlCatalogIsEmpty(super)) {
			    remove(XML_SGML_DEFAULT_CATALOG);
			} else {
			    out = fopen(XML_SGML_DEFAULT_CATALOG, "wb");
			    if (out == NULL) {
				fprintf(stderr,
					"could not open %s for saving\n",
					XML_SGML_DEFAULT_CATALOG);
				exit_value = 2;
				noout = 0;
			    } else {

				xmlACatalogDump(super, out);
				fclose(out);
			    }
			}
		    }
		} else {
		    xmlACatalogDump(catal, stdout);
		}
		i += 2;

                xmlFreeCatalog(catal);
                xmlFreeCatalog(super);
	    } else {
		if ((!strcmp(argv[i], "-add")) ||
		    (!strcmp(argv[i], "--add"))) {
			if ((argv[i + 3] == NULL) || (argv[i + 3][0] == 0))
			    ret = xmlCatalogAdd(BAD_CAST argv[i + 1], NULL,
						BAD_CAST argv[i + 2]);
			else
			    ret = xmlCatalogAdd(BAD_CAST argv[i + 1],
						BAD_CAST argv[i + 2],
						BAD_CAST argv[i + 3]);
			if (ret != 0) {
			    printf("add command failed\n");
			    exit_value = 3;
			}
			i += 3;
		} else if ((!strcmp(argv[i], "-del")) ||
		    (!strcmp(argv[i], "--del"))) {
		    ret = xmlCatalogRemove(BAD_CAST argv[i + 1]);
		    if (ret < 0) {
			fprintf(stderr, "Failed to remove entry %s\n",
				argv[i + 1]);
			exit_value = 1;
		    }
		    i += 1;
		}
	    }
	}

    } else if (shell) {
	usershell();
    } else {
	for (i++; i < argc; i++) {
	    xmlURIPtr uri;
	    xmlChar *ans;

	    uri = xmlParseURI(argv[i]);
	    if (uri == NULL) {
		ans = xmlCatalogResolvePublic((const xmlChar *) argv[i]);
		if (ans == NULL) {
		    printf("No entry for PUBLIC %s\n", argv[i]);
		    exit_value = 4;
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    } else {
                xmlFreeURI(uri);
		ans = xmlCatalogResolveSystem((const xmlChar *) argv[i]);
		if (ans == NULL) {
		    printf("No entry for SYSTEM %s\n", argv[i]);
		    ans = xmlCatalogResolveURI ((const xmlChar *) argv[i]);
		    if (ans == NULL) {
			printf ("No entry for URI %s\n", argv[i]);
		        exit_value = 4;
		    } else {
		        printf("%s\n", (char *) ans);
			xmlFree (ans);
		    }
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    }
	}
    }
    if ((!sgml) && ((add) || (del) || (create) || (convert))) {
	if (noout && filename && *filename) {
	    FILE *out;

	    out = fopen(filename, "wb");
	    if (out == NULL) {
		fprintf(stderr, "could not open %s for saving\n", filename);
		exit_value = 2;
		noout = 0;
	    } else {
		xmlCatalogDump(out);
	    }
	} else {
	    xmlCatalogDump(stdout);
	}
    }

    /*
     * Cleanup and check for memory leaks
     */
    xmlCleanupParser();
    return(exit_value);
}